

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftp.c
# Opt level: O3

CURLcode ftp_state_size_resp(Curl_easy *data,int ftpcode,ftpstate instate)

{
  ulong uVar1;
  char *pcVar2;
  int iVar3;
  CURLcode CVar4;
  char *pcVar5;
  void *pvVar6;
  curl_off_t size;
  char *str;
  curl_off_t filesize;
  char clbuf [128];
  curl_off_t local_b0;
  char local_a8 [128];
  
  local_b0 = -1;
  pcVar5 = Curl_dyn_ptr(&(data->conn->proto).ftpc.pp.recvbuf);
  if (ftpcode == 0xd5) {
    pcVar5 = pcVar5 + 4;
    pvVar6 = memchr(pcVar5,0xd,(data->conn->proto).ftpc.pp.nfinal);
    str = pcVar5;
    if (pvVar6 != (void *)0x0) {
      pcVar2 = (char *)((long)pvVar6 + -2);
      if (*(char *)((long)pvVar6 + -1) != '\n') {
        pcVar2 = (char *)((long)pvVar6 + -1);
      }
      do {
        str = pcVar2;
        if (str <= pcVar5) break;
        pcVar2 = str + -1;
      } while ((byte)(str[-1] - 0x30U) < 10);
    }
    curlx_strtoofft(str,(char **)0x0,10,&local_b0);
  }
  else if (instate != '\x19' && ftpcode == 0x226) {
    Curl_failf(data,"The file does not exist");
    return CURLE_REMOTE_FILE_NOT_FOUND;
  }
  if (instate == '\x19') {
    (data->state).resume_from = local_b0;
    CVar4 = ftp_state_ul_setup(data,true);
  }
  else if (instate == '\x18') {
    Curl_pgrsSetDownloadSize(data,local_b0);
    CVar4 = ftp_state_retr(data,local_b0);
  }
  else {
    CVar4 = CURLE_OK;
    if (instate == '\x17') {
      if (local_b0 == -1) {
        size = -1;
      }
      else {
        iVar3 = curl_msnprintf(local_a8,0x80,"Content-Length: %ld\r\n");
        uVar1 = *(ulong *)&(data->set).field_0x8ba;
        *(ulong *)&(data->set).field_0x8ba = uVar1 | 0x1000000;
        CVar4 = Curl_client_write(data,4,local_a8,(long)iVar3);
        *(ulong *)&(data->set).field_0x8ba =
             *(ulong *)&(data->set).field_0x8ba & 0xfffffffffeffffff | uVar1 & 0x1000000;
        size = local_b0;
        if (CVar4 != CURLE_OK) {
          return CVar4;
        }
      }
      Curl_pgrsSetDownloadSize(data,size);
      CVar4 = ftp_state_rest(data,data->conn);
    }
  }
  return CVar4;
}

Assistant:

static CURLcode ftp_state_size_resp(struct Curl_easy *data,
                                    int ftpcode,
                                    ftpstate instate)
{
  CURLcode result = CURLE_OK;
  curl_off_t filesize = -1;
  char *buf = Curl_dyn_ptr(&data->conn->proto.ftpc.pp.recvbuf);
  size_t len = data->conn->proto.ftpc.pp.nfinal;

  /* get the size from the ascii string: */
  if(ftpcode == 213) {
    /* To allow servers to prepend "rubbish" in the response string, we scan
       for all the digits at the end of the response and parse only those as a
       number. */
    char *start = &buf[4];
    char *fdigit = memchr(start, '\r', len);
    if(fdigit) {
      fdigit--;
      if(*fdigit == '\n')
        fdigit--;
      while(ISDIGIT(fdigit[-1]) && (fdigit > start))
        fdigit--;
    }
    else
      fdigit = start;
    /* ignores parsing errors, which will make the size remain unknown */
    (void)curlx_strtoofft(fdigit, NULL, 10, &filesize);

  }
  else if(ftpcode == 550) { /* "No such file or directory" */
    /* allow a SIZE failure for (resumed) uploads, when probing what command
       to use */
    if(instate != FTP_STOR_SIZE) {
      failf(data, "The file does not exist");
      return CURLE_REMOTE_FILE_NOT_FOUND;
    }
  }

  if(instate == FTP_SIZE) {
#ifdef CURL_FTP_HTTPSTYLE_HEAD
    if(-1 != filesize) {
      char clbuf[128];
      int clbuflen = msnprintf(clbuf, sizeof(clbuf),
                "Content-Length: %" CURL_FORMAT_CURL_OFF_T "\r\n", filesize);
      result = client_write_header(data, clbuf, clbuflen);
      if(result)
        return result;
    }
#endif
    Curl_pgrsSetDownloadSize(data, filesize);
    result = ftp_state_rest(data, data->conn);
  }
  else if(instate == FTP_RETR_SIZE) {
    Curl_pgrsSetDownloadSize(data, filesize);
    result = ftp_state_retr(data, filesize);
  }
  else if(instate == FTP_STOR_SIZE) {
    data->state.resume_from = filesize;
    result = ftp_state_ul_setup(data, TRUE);
  }

  return result;
}